

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int bb_spi_xfer(int pi,uint CS,char *txBuf,char *rxBuf,uint count)

{
  int sent;
  gpioExtent_t ext [1];
  
  ext[0].size = (size_t)count;
  ext[0].ptr = txBuf;
  sent = pigpio_command_ext(pi,0x71,CS,0,count,1,ext,0);
  if (0 < sent) {
    sent = recvMax(pi,rxBuf,count,sent);
  }
  _pmu(pi);
  return sent;
}

Assistant:

int bb_spi_xfer(
   int pi,
   unsigned CS,
   char    *txBuf,
   char    *rxBuf,
   unsigned count)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=CS
   p2=0
   p3=count
   ## extension ##
   char txBuf[count]
   */

   ext[0].size = count;
   ext[0].ptr = txBuf;

   bytes = pigpio_command_ext
      (pi, PI_CMD_BSPIX, CS, 0, count, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, rxBuf, count, bytes);
   }

   _pmu(pi);

   return bytes;
}